

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

void __thiscall
slang::SourceManager::addLineDirective
          (SourceManager *this,SourceLocation location,size_t lineNum,string_view name,uint8_t level
          )

{
  char cVar1;
  SourceLocation location_00;
  ulong uVar2;
  path *ppVar3;
  pointer pvVar4;
  size_t sourceLineNum;
  unique_lock<std::shared_mutex> lock;
  error_code ec;
  path full;
  path linePath;
  uint8_t local_119;
  size_t local_118;
  unique_lock<std::shared_mutex> local_110;
  size_t local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined4 local_d8;
  undefined8 local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  path local_b8;
  path local_90;
  path local_68;
  error_code local_40 [2];
  
  local_c8._M_str = name._M_str;
  local_c8._M_len = name._M_len;
  local_110._M_owns = false;
  local_119 = level;
  local_110._M_device = &this->mutex;
  local_100 = lineNum;
  std::unique_lock<std::shared_mutex>::lock(&local_110);
  local_110._M_owns = true;
  location_00 = getFullyExpandedLocImpl<std::unique_lock<std::shared_mutex>_>
                          (this,location,&local_110);
  uVar2 = (ulong)location_00 & 0xfffffff;
  if ((((uVar2 == 0) ||
       (pvVar4 = (this->bufferEntries).
                 super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (ulong)((long)(this->bufferEntries).
                     super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 6) <= uVar2)) ||
      (*(__index_type *)
        ((long)&pvVar4[uVar2].
                super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                .
                super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                .
                super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
        + 0x38) != '\0')) ||
     (pvVar4 = pvVar4 + uVar2,
     *(long *)&(pvVar4->
               super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
               ).
               super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
               .
               super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
     == 0)) goto LAB_0014a9ae;
  std::filesystem::__cxx11::path::path(&local_b8);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_68,&local_c8,auto_format);
  local_d8 = 0;
  local_d0 = std::_V2::system_category();
  if (this->disableProximatePaths == false) {
    cVar1 = std::filesystem::__cxx11::path::has_relative_path();
    if (cVar1 == '\0') goto LAB_0014a8e7;
    std::filesystem::current_path_abi_cxx11_(local_40);
    std::filesystem::__cxx11::path::lexically_proximate(&local_90);
    addLineDirective();
  }
  else {
LAB_0014a8e7:
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_90,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                &(pvVar4->
                 super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 ).
                 super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
               ,auto_format);
    ppVar3 = (path *)std::filesystem::__cxx11::path::replace_filename(&local_90);
    std::filesystem::__cxx11::path::operator=(&local_b8,ppVar3);
    std::filesystem::__cxx11::path::~path(&local_90);
  }
  local_118 = getRawLineNumber<std::unique_lock<std::shared_mutex>_>(this,location_00,&local_110);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_b8._M_pathname._M_dataplus._M_p,
             local_b8._M_pathname._M_dataplus._M_p + local_b8._M_pathname._M_string_length);
  std::
  vector<slang::SourceManager::LineDirectiveInfo,std::allocator<slang::SourceManager::LineDirectiveInfo>>
  ::emplace_back<std::__cxx11::string,unsigned_long&,unsigned_long&,unsigned_char&>
            ((vector<slang::SourceManager::LineDirectiveInfo,std::allocator<slang::SourceManager::LineDirectiveInfo>>
              *)((long)&(pvVar4->
                        super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                        ).
                        super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                        .
                        super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                + 0x20),&local_f8,&local_118,&local_100,&local_119);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_68);
  std::filesystem::__cxx11::path::~path(&local_b8);
LAB_0014a9ae:
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_110);
  return;
}

Assistant:

void SourceManager::addLineDirective(SourceLocation location, size_t lineNum, std::string_view name,
                                     uint8_t level) {
    std::unique_lock<std::shared_mutex> lock(mutex);
    SourceLocation fileLocation = getFullyExpandedLocImpl(location, lock);
    FileInfo* info = getFileInfo(fileLocation.buffer(), lock);
    if (!info || !info->data)
        return;

    fs::path full;
    fs::path linePath = name;
    std::error_code ec;
    if (!disableProximatePaths && linePath.has_relative_path())
        full = linePath.lexically_proximate(fs::current_path(ec));
    else
        full = fs::path(info->data->name).replace_filename(linePath);

    size_t sourceLineNum = getRawLineNumber(fileLocation, lock);
    info->lineDirectives.emplace_back(std::string(getU8Str(full)), sourceLineNum, lineNum, level);
}